

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpdf_encoder_cnt.c
# Opt level: O2

HPDF_STATUS ETen_B5_H_Init(HPDF_Encoder encoder)

{
  void *pvVar1;
  HPDF_STATUS HVar2;
  
  HVar2 = HPDF_CMapEncoder_InitAttr(encoder);
  if (HVar2 != 0) {
    return HVar2;
  }
  pvVar1 = encoder->attr;
  HVar2 = HPDF_CMapEncoder_AddCMap(encoder,CMAP_ARRAY_ETen_B5_H);
  if (HVar2 == 0) {
    HVar2 = ETen_B5_AddCodeSpaceRange(encoder);
    if (HVar2 != 0) {
      return HVar2;
    }
    HVar2 = HPDF_CMapEncoder_AddNotDefRange(encoder,(HPDF_CidRange_Rec)0x3550001f0000);
    if (HVar2 == 0) {
      HPDF_CMapEncoder_SetUnicodeArray(encoder,CP950_UNICODE_ARRAY);
      *(code **)((long)pvVar1 + 0x40220) = ETen_B5_IsLeadByte;
      *(code **)((long)pvVar1 + 0x40228) = ETen_B5_IsTrialByte;
      HPDF_StrCpy((char *)((long)pvVar1 + 0x4011c),"Adobe",(char *)((long)pvVar1 + 0x4019b));
      HPDF_StrCpy((char *)((long)pvVar1 + 0x4019c),"CNS1",(char *)((long)pvVar1 + 0x4021b));
      *(undefined4 *)((long)pvVar1 + 0x4021c) = 0;
      *(undefined8 *)((long)pvVar1 + 0x40230) = 0x1000000c8;
      *(undefined8 *)((long)pvVar1 + 0x40238) = 0x632e0000000a;
      encoder->type = HPDF_ENCODER_TYPE_DOUBLE_BYTE;
      return 0;
    }
  }
  return encoder->error->error_no;
}

Assistant:

static HPDF_STATUS
ETen_B5_H_Init  (HPDF_Encoder  encoder)
{
    HPDF_CMapEncoderAttr attr;
    HPDF_STATUS ret;

    if ((ret = HPDF_CMapEncoder_InitAttr (encoder)) != HPDF_OK)
        return ret;

    attr = (HPDF_CMapEncoderAttr)encoder->attr;

    if (HPDF_CMapEncoder_AddCMap (encoder, CMAP_ARRAY_ETen_B5_H) != HPDF_OK)
        return encoder->error->error_no;

    if ((ret = ETen_B5_AddCodeSpaceRange (encoder)) != HPDF_OK)
        return ret;

    if (HPDF_CMapEncoder_AddNotDefRange (encoder, ETen_B5_NOTDEF_RANGE)
                != HPDF_OK)
        return encoder->error->error_no;

    HPDF_CMapEncoder_SetUnicodeArray (encoder, CP950_UNICODE_ARRAY);

    attr->is_lead_byte_fn = ETen_B5_IsLeadByte;
    attr->is_trial_byte_fn = ETen_B5_IsTrialByte;
    HPDF_StrCpy (attr->registry, "Adobe", attr->registry +
                HPDF_LIMIT_MAX_NAME_LEN);
    HPDF_StrCpy (attr->ordering, "CNS1", attr->ordering +
                HPDF_LIMIT_MAX_NAME_LEN);
    attr->suppliment = 0;
    attr->uid_offset = 200;
    attr->xuid[0] = 1;
    attr->xuid[1] = 10;
    attr->xuid[2] = 25390;

    encoder->type = HPDF_ENCODER_TYPE_DOUBLE_BYTE;

    return HPDF_OK;
}